

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O2

lzma_ret lzma_raw_decoder(lzma_stream *strm,lzma_filter *options)

{
  lzma_internal *plVar1;
  lzma_ret lVar2;
  
  lVar2 = lzma_strm_init(strm);
  if (lVar2 == LZMA_OK) {
    lVar2 = lzma_raw_decoder_init(&strm->internal->next,strm->allocator,options);
    if (lVar2 == LZMA_OK) {
      plVar1 = strm->internal;
      plVar1->supported_actions[0] = true;
      plVar1->supported_actions[3] = true;
      lVar2 = LZMA_OK;
    }
    else {
      lzma_end(strm);
    }
  }
  return lVar2;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_raw_decoder(lzma_stream *strm, const lzma_filter *options)
{
	lzma_next_strm_init(lzma_raw_decoder_init, strm, options);

	strm->internal->supported_actions[LZMA_RUN] = true;
	strm->internal->supported_actions[LZMA_FINISH] = true;

	return LZMA_OK;
}